

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

If_Man_t * Gia_ManToIf(Gia_Man_t *p,If_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  If_Man_t *p_00;
  char *pcVar4;
  If_Obj_t *pIVar5;
  Gia_Obj_t *pGVar6;
  If_Obj_t *pIVar7;
  bool bVar8;
  Gia_Obj_t *local_48;
  Gia_Obj_t *pPrev;
  Gia_Obj_t *pSibl;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  If_Obj_t *pIfObj;
  If_Man_t *pIfMan;
  If_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  Gia_ManChoiceLevel(p);
  iVar1 = Gia_ManHasChoices(p);
  if (iVar1 != 0) {
    Gia_ManMarkFanoutDrivers(p);
  }
  p_00 = If_ManStart(pPars);
  pcVar4 = Gia_ManName(p);
  pcVar4 = Abc_UtilStrsav(pcVar4);
  p_00->pName = pcVar4;
  iVar1 = Gia_ManObjNum(p);
  if (1.0 < ((double)iVar1 * 1.0 * (double)p_00->nObjBytes) / 1073741824.0) {
    iVar2 = Gia_ManObjNum(p);
    iVar1 = p_00->nObjBytes;
    uVar3 = Gia_ManObjNum(p);
    printf("Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n"
           ,((double)iVar2 * 1.0 * (double)iVar1) / 1073741824.0,(ulong)uVar3);
  }
  Gia_ManFillValue(p);
  pIVar5 = If_ManConst1(p_00);
  uVar3 = If_ObjId(pIVar5);
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = uVar3;
  pSibl._4_4_ = 1;
  while( true ) {
    bVar8 = false;
    if (pSibl._4_4_ < p->nObjs) {
      pGStack_30 = Gia_ManObj(p,pSibl._4_4_);
      bVar8 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) {
      iVar1 = Gia_ManHasChoices(p);
      if (iVar1 != 0) {
        Gia_ManCleanMark0(p);
      }
      return p_00;
    }
    iVar1 = Gia_ObjIsAnd(pGStack_30);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_30);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_30);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x32b,"If_Man_t *Gia_ManToIf(Gia_Man_t *, If_Par_t *)");
        }
        pIVar5 = If_ManFanin0Copy(p_00,pGStack_30);
        pGVar6 = Gia_ObjFanin0(pGStack_30);
        iVar1 = Gia_ObjIsConst0(pGVar6);
        pIVar5 = If_NotCond(pIVar5,iVar1);
        pObj = (Gia_Obj_t *)If_ManCreateCo(p_00,pIVar5);
      }
      else {
        pObj = (Gia_Obj_t *)If_ManCreateCi(p_00);
        iVar1 = Gia_ObjLevel(p,pGStack_30);
        If_ObjSetLevel((If_Obj_t *)pObj,iVar1);
        if (p_00->nLevelMax < (int)(*(uint *)pObj >> 0xd)) {
          p_00->nLevelMax = *(uint *)pObj >> 0xd;
        }
      }
    }
    else {
      pIVar5 = If_ManFanin0Copy(p_00,pGStack_30);
      pIVar7 = If_ManFanin1Copy(p_00,pGStack_30);
      pObj = (Gia_Obj_t *)If_ManCreateAnd(p_00,pIVar5,pIVar7);
    }
    iVar1 = If_ObjId((If_Obj_t *)pObj);
    if (pSibl._4_4_ != iVar1) break;
    iVar1 = If_ObjId((If_Obj_t *)pObj);
    Gia_ObjSetValue(pGStack_30,iVar1);
    iVar1 = Gia_ObjSibl(p,pSibl._4_4_);
    if ((iVar1 != 0) && ((*(ulong *)pGStack_30 >> 0x1e & 1) != 0)) {
      local_48 = pGStack_30;
      pPrev = Gia_ObjSiblObj(p,pSibl._4_4_);
      while (pPrev != (Gia_Obj_t *)0x0) {
        iVar1 = Gia_ObjValue(local_48);
        pIVar5 = If_ManObj(p_00,iVar1);
        iVar1 = Gia_ObjValue(pPrev);
        pIVar7 = If_ManObj(p_00,iVar1);
        If_ObjSetChoice(pIVar5,pIVar7);
        local_48 = pPrev;
        iVar1 = Gia_ObjId(p,pPrev);
        pPrev = Gia_ObjSiblObj(p,iVar1);
      }
      iVar1 = Gia_ObjValue(pGStack_30);
      pIVar5 = If_ManObj(p_00,iVar1);
      If_ManCreateChoice(p_00,pIVar5);
      pPars->fExpRed = 0;
    }
    pSibl._4_4_ = pSibl._4_4_ + 1;
  }
  __assert_fail("i == If_ObjId(pIfObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                ,0x32c,"If_Man_t *Gia_ManToIf(Gia_Man_t *, If_Par_t *)");
}

Assistant:

If_Man_t * Gia_ManToIf( Gia_Man_t * p, If_Par_t * pPars )
{
    If_Man_t * pIfMan;
    If_Obj_t * pIfObj = NULL;
    Gia_Obj_t * pObj;
    int i;
    // create levels with choices
    Gia_ManChoiceLevel( p );
    // mark representative nodes
    if ( Gia_ManHasChoices(p) )
        Gia_ManMarkFanoutDrivers( p );
    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->pName = Abc_UtilStrsav( Gia_ManName(p) );
    // print warning about excessive memory usage
    if ( 1.0 * Gia_ManObjNum(p) * pIfMan->nObjBytes / (1<<30) > 1.0 )
        printf( "Warning: The mapper will allocate %.1f GB for to represent the subject graph with %d AIG nodes.\n", 
            1.0 * Gia_ManObjNum(p) * pIfMan->nObjBytes / (1<<30), Gia_ManObjNum(p) );
    // load the AIG into the mapper
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = If_ObjId( If_ManConst1(pIfMan) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pIfObj = If_ManCreateAnd( pIfMan, If_ManFanin0Copy(pIfMan, pObj), If_ManFanin1Copy(pIfMan, pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pIfObj = If_ManCreateCi( pIfMan );
            If_ObjSetLevel( pIfObj, Gia_ObjLevel(p, pObj) );
//            Abc_Print( 1, "pi%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
            if ( pIfMan->nLevelMax < (int)pIfObj->Level )
                pIfMan->nLevelMax = (int)pIfObj->Level;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pIfObj = If_ManCreateCo( pIfMan, If_NotCond( If_ManFanin0Copy(pIfMan, pObj), Gia_ObjIsConst0(Gia_ObjFanin0(pObj))) );
//            Abc_Print( 1, "po%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else assert( 0 );
        assert( i == If_ObjId(pIfObj) );
        Gia_ObjSetValue( pObj, If_ObjId(pIfObj) );
        // set up the choice node
        if ( Gia_ObjSibl(p, i) && pObj->fMark0 )
        {
            Gia_Obj_t * pSibl, * pPrev;
            for ( pPrev = pObj, pSibl = Gia_ObjSiblObj(p, i); pSibl; pPrev = pSibl, pSibl = Gia_ObjSiblObj(p, Gia_ObjId(p, pSibl)) )
                If_ObjSetChoice( If_ManObj(pIfMan, Gia_ObjValue(pPrev)), If_ManObj(pIfMan, Gia_ObjValue(pSibl)) );
            If_ManCreateChoice( pIfMan, If_ManObj(pIfMan, Gia_ObjValue(pObj)) );
            pPars->fExpRed = 0;
        }
//        assert( If_ObjLevel(pIfObj) == Gia_ObjLevel(pNode) );
    }
    if ( Gia_ManHasChoices(p) )
        Gia_ManCleanMark0( p );
    return pIfMan;
}